

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2js.h
# Opt level: O3

void __thiscall
wasm::Wasm2JSBuilder::addFunctionImport(Wasm2JSBuilder *this,Ref ast,Function *import)

{
  char *pcVar1;
  Ref r;
  Ref RVar2;
  Ref value;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  int iVar6;
  int iVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  IString IVar13;
  IString name;
  
  pcVar1 = (import->super_Importable).base.super_IString.str._M_str;
  iVar6 = (int)pcVar1;
  iVar7 = (int)((ulong)pcVar1 >> 0x20);
  value.inst = (Value *)CONCAT71(0xda88,DAT_00da88d0 == pcVar1);
  auVar9._0_4_ = -(uint)((int)DAT_00da8900 == iVar6);
  auVar9._4_4_ = -(uint)((int)((ulong)DAT_00da8900 >> 0x20) == iVar7);
  auVar9._8_4_ = -(uint)((int)DAT_00da88c0 == iVar6);
  auVar9._12_4_ = -(uint)((int)((ulong)DAT_00da88c0 >> 0x20) == iVar7);
  auVar12._4_4_ = auVar9._0_4_;
  auVar12._0_4_ = auVar9._4_4_;
  auVar12._8_4_ = auVar9._12_4_;
  auVar12._12_4_ = auVar9._8_4_;
  auVar11._0_4_ = -(uint)((int)DAT_00da88a0 == iVar6);
  auVar11._4_4_ = -(uint)((int)((ulong)DAT_00da88a0 >> 0x20) == iVar7);
  auVar11._8_4_ = -(uint)((int)DAT_00da88b0 == iVar6);
  auVar11._12_4_ = -(uint)((int)((ulong)DAT_00da88b0 >> 0x20) == iVar7);
  auVar10._4_4_ = auVar11._0_4_;
  auVar10._0_4_ = auVar11._4_4_;
  auVar10._8_4_ = auVar11._12_4_;
  auVar10._12_4_ = auVar11._8_4_;
  auVar11 = packssdw(auVar10 & auVar11,auVar12 & auVar9);
  auVar3._0_4_ = -(uint)((int)DAT_00da8880 == iVar6);
  auVar3._4_4_ = -(uint)((int)((ulong)DAT_00da8880 >> 0x20) == iVar7);
  auVar3._8_4_ = -(uint)((int)DAT_00da8890 == iVar6);
  auVar3._12_4_ = -(uint)((int)((ulong)DAT_00da8890 >> 0x20) == iVar7);
  auVar8._4_4_ = auVar3._0_4_;
  auVar8._0_4_ = auVar3._4_4_;
  auVar8._8_4_ = auVar3._12_4_;
  auVar8._12_4_ = auVar3._8_4_;
  auVar5._0_4_ = -(uint)((int)DAT_00da8860 == iVar6);
  auVar5._4_4_ = -(uint)((int)((ulong)DAT_00da8860 >> 0x20) == iVar7);
  auVar5._8_4_ = -(uint)((int)DAT_00da8870 == iVar6);
  auVar5._12_4_ = -(uint)((int)((ulong)DAT_00da8870 >> 0x20) == iVar7);
  auVar4._4_4_ = auVar5._0_4_;
  auVar4._0_4_ = auVar5._4_4_;
  auVar4._8_4_ = auVar5._12_4_;
  auVar4._12_4_ = auVar5._8_4_;
  auVar5 = packssdw(auVar4 & auVar5,auVar8 & auVar3);
  auVar5 = packssdw(auVar5,auVar11);
  if (((((((((((auVar5 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
              (auVar5 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar5 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar5 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar5 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar5 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
         (auVar5 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar5[0xf]) &&
       (DAT_00da88d0 != pcVar1)) && (DAT_00da88e0 != pcVar1)) &&
     (((DAT_00da88f0 != pcVar1 && (DAT_00da8910 != pcVar1)) &&
      ((DAT_00da8920 != pcVar1 && (DAT_00da8930 != pcVar1)))))) {
    ensureModuleVar(this,ast,&import->super_Importable);
    r = cashew::ValueBuilder::makeVar(false);
    cashew::Value::push_back(ast.inst,r);
    IVar13 = fromName(this,(import->super_Importable).super_Named.name.super_IString.str,Top);
    name.str._M_len = IVar13.str._M_str;
    RVar2 = getImportName(this,&import->super_Importable);
    name.str._M_str = (char *)RVar2.inst;
    cashew::ValueBuilder::appendToVar((ValueBuilder *)r.inst,(Value *)IVar13.str._M_len,name,value);
    return;
  }
  return;
}

Assistant:

void Wasm2JSBuilder::addFunctionImport(Ref ast, Function* import) {
  // The scratch memory helpers are emitted in the glue, see code and comments
  // below.
  if (ABI::wasm2js::isHelper(import->base)) {
    return;
  }
  ensureModuleVar(ast, *import);
  Ref theVar = ValueBuilder::makeVar();
  ast->push_back(theVar);
  ValueBuilder::appendToVar(
    theVar, fromName(import->name, NameScope::Top), getImportName(*import));
}